

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5VocabFilterMethod
              (sqlite3_vtab_cursor *pCursor,int idxNum,char *zUnused,int nUnused,
              sqlite3_value **apVal)

{
  int nToken;
  int iVar1;
  int iVar2;
  char *pcVar3;
  sqlite3_vtab *__dest;
  char *__src;
  int flags;
  sqlite3_value *pVal;
  ulong uVar4;
  sqlite3_value *pVal_00;
  sqlite3_value *pVal_01;
  bool bVar5;
  char *local_48;
  
  iVar2 = pCursor->pVtab[2].nRef;
  pCursor[10].pVtab = (sqlite3_vtab *)0x0;
  sqlite3Fts5IterClose((Fts5IndexIter *)pCursor[4].pVtab);
  pCursor[4].pVtab = (sqlite3_vtab *)0x0;
  sqlite3_free(pCursor[6].pVtab);
  *(undefined4 *)&pCursor[5].pVtab = 0xffffffff;
  pCursor[6].pVtab = (sqlite3_vtab *)0x0;
  *(undefined4 *)&pCursor[3].pVtab = 0;
  pVal = (sqlite3_value *)0x0;
  bVar5 = (idxNum & 1U) != 0;
  if (bVar5) {
    pVal = *apVal;
  }
  if ((idxNum & 2U) == 0) {
    pVal_01 = (sqlite3_value *)0x0;
    uVar4 = (ulong)bVar5;
  }
  else {
    uVar4 = (ulong)(bVar5 + 1);
    pVal_01 = apVal[bVar5];
  }
  if ((idxNum & 4U) == 0) {
    pVal_00 = (sqlite3_value *)0x0;
  }
  else {
    pVal_00 = apVal[uVar4];
  }
  if (pVal == (sqlite3_value *)0x0) {
    iVar1 = 0;
    if (pVal_01 == (sqlite3_value *)0x0) {
      local_48 = (char *)0x0;
      nToken = 0;
    }
    else {
      local_48 = (char *)sqlite3ValueText(pVal_01,'\x01');
      nToken = sqlite3ValueBytes(pVal_01,'\x01');
    }
    bVar5 = true;
    flags = 8;
    if (pVal_00 != (sqlite3_value *)0x0) {
      pcVar3 = (char *)sqlite3ValueText(pVal_00,'\x01');
      iVar1 = sqlite3ValueBytes(pVal_00,'\x01');
      *(int *)&pCursor[5].pVtab = iVar1;
      __dest = (sqlite3_vtab *)sqlite3_malloc(iVar1 + 1);
      pCursor[6].pVtab = __dest;
      iVar1 = 0;
      if (__dest == (sqlite3_vtab *)0x0) {
        iVar1 = 7;
        bVar5 = false;
      }
      else {
        __src = "";
        if (pcVar3 != (char *)0x0) {
          __src = pcVar3;
        }
        memcpy(__dest,__src,(long)*(int *)&pCursor[5].pVtab + 1);
      }
    }
  }
  else {
    local_48 = (char *)sqlite3ValueText(pVal,'\x01');
    nToken = sqlite3ValueBytes(pVal,'\x01');
    bVar5 = true;
    flags = 0;
    iVar1 = 0;
  }
  if (bVar5) {
    iVar1 = sqlite3Fts5IndexQuery
                      (*(Fts5Index **)&pCursor[2].pVtab[1].nRef,local_48,nToken,flags,
                       (Fts5Colset *)0x0,(Fts5IndexIter **)(pCursor + 4));
  }
  if (iVar2 == 2 && iVar1 == 0) {
    iVar1 = fts5VocabInstanceNewTerm((Fts5VocabCursor *)pCursor);
  }
  if (((iVar1 == 0) && (iVar1 = 0, *(int *)&pCursor[3].pVtab == 0)) &&
     ((iVar2 != 2 || (*(int *)((long)&(pCursor[2].pVtab[1].pModule)->xColumn + 4) != 1)))) {
    iVar2 = fts5VocabNextMethod(pCursor);
    return iVar2;
  }
  return iVar1;
}

Assistant:

static int fts5VocabFilterMethod(
  sqlite3_vtab_cursor *pCursor,   /* The cursor used for this query */
  int idxNum,                     /* Strategy index */
  const char *zUnused,            /* Unused */
  int nUnused,                    /* Number of elements in apVal */
  sqlite3_value **apVal           /* Arguments for the indexing scheme */
){
  Fts5VocabTable *pTab = (Fts5VocabTable*)pCursor->pVtab;
  Fts5VocabCursor *pCsr = (Fts5VocabCursor*)pCursor;
  int eType = pTab->eType;
  int rc = SQLITE_OK;

  int iVal = 0;
  int f = FTS5INDEX_QUERY_SCAN;
  const char *zTerm = 0;
  int nTerm = 0;

  sqlite3_value *pEq = 0;
  sqlite3_value *pGe = 0;
  sqlite3_value *pLe = 0;

  UNUSED_PARAM2(zUnused, nUnused);

  fts5VocabResetCursor(pCsr);
  if( idxNum & FTS5_VOCAB_TERM_EQ ) pEq = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_GE ) pGe = apVal[iVal++];
  if( idxNum & FTS5_VOCAB_TERM_LE ) pLe = apVal[iVal++];

  if( pEq ){
    zTerm = (const char *)sqlite3_value_text(pEq);
    nTerm = sqlite3_value_bytes(pEq);
    f = 0;
  }else{
    if( pGe ){
      zTerm = (const char *)sqlite3_value_text(pGe);
      nTerm = sqlite3_value_bytes(pGe);
    }
    if( pLe ){
      const char *zCopy = (const char *)sqlite3_value_text(pLe);
      if( zCopy==0 ) zCopy = "";
      pCsr->nLeTerm = sqlite3_value_bytes(pLe);
      pCsr->zLeTerm = sqlite3_malloc(pCsr->nLeTerm+1);
      if( pCsr->zLeTerm==0 ){
        rc = SQLITE_NOMEM;
      }else{
        memcpy(pCsr->zLeTerm, zCopy, pCsr->nLeTerm+1);
      }
    }
  }

  if( rc==SQLITE_OK ){
    Fts5Index *pIndex = pCsr->pFts5->pIndex;
    rc = sqlite3Fts5IndexQuery(pIndex, zTerm, nTerm, f, 0, &pCsr->pIter);
  }
  if( rc==SQLITE_OK && eType==FTS5_VOCAB_INSTANCE ){
    rc = fts5VocabInstanceNewTerm(pCsr);
  }
  if( rc==SQLITE_OK && !pCsr->bEof 
   && (eType!=FTS5_VOCAB_INSTANCE 
    || pCsr->pFts5->pConfig->eDetail!=FTS5_DETAIL_NONE)
  ){
    rc = fts5VocabNextMethod(pCursor);
  }

  return rc;
}